

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar1 = pAig->vObjs->nSize;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar5;
  uVar10 = 0;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  pVVar3 = pAig->vCis;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    uVar8 = 0;
    do {
      iVar5 = *(int *)((long)ppvVar4[uVar8] + 0x24);
      if (((long)iVar5 < 0) || (iVar1 <= iVar5)) goto LAB_007dec60;
      uVar10 = uVar8 + 1;
      __s[iVar5] = (int)uVar8;
      uVar8 = uVar10;
    } while ((long)uVar10 < (long)pVVar3->nSize);
  }
  lVar7 = (long)pAig->nRegs;
  if (0 < lVar7) {
    pVVar3 = pAig->vCos;
    iVar5 = pAig->nTruePos;
    lVar9 = (long)iVar5;
    do {
      if ((iVar5 < 0) || (pVVar3->nSize <= lVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar3->pArray[lVar9] + 0x24);
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
LAB_007dec60:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = (int)uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}